

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O1

void __thiscall
cbtCollisionWorld::rayTestSingleInternal::RayTester::ProcessLeaf(RayTester *this,int i)

{
  float fVar1;
  cbtScalar cVar2;
  float fVar3;
  cbtScalar cVar4;
  cbtScalar cVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  float fVar8;
  cbtScalar cVar9;
  cbtScalar cVar10;
  float fVar11;
  cbtScalar cVar12;
  cbtScalar cVar13;
  cbtScalar cVar14;
  cbtScalar cVar15;
  cbtScalar cVar16;
  cbtScalar cVar17;
  cbtCompoundShapeChild *pcVar18;
  cbtTransform *pcVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  cbtCollisionObjectWrapper tmpOb;
  LocalInfoAdder2 my_cb;
  cbtTransform childWorldTrans;
  cbtCollisionObjectWrapper local_a0;
  RayResultCallback local_78;
  RayResultCallback *local_50;
  int local_48;
  cbtTransform local_40;
  
  pcVar18 = (this->m_compoundShape->m_children).m_data;
  local_a0.m_shape = pcVar18[i].m_childShape;
  pcVar19 = this->m_colObjWorldTransform;
  fVar1 = pcVar18[i].m_transform.m_basis.m_el[1].m_floats[0];
  cVar2 = (pcVar19->m_basis).m_el[0].m_floats[0];
  fVar3 = (pcVar19->m_basis).m_el[0].m_floats[1];
  cVar4 = pcVar18[i].m_transform.m_basis.m_el[0].m_floats[0];
  cVar5 = pcVar18[i].m_transform.m_basis.m_el[0].m_floats[1];
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar3)),ZEXT416((uint)cVar4),ZEXT416((uint)cVar2)
                           );
  cVar6 = pcVar18[i].m_transform.m_basis.m_el[2].m_floats[0];
  cVar7 = (pcVar19->m_basis).m_el[0].m_floats[2];
  auVar20 = vfmadd231ss_fma(auVar26,ZEXT416((uint)cVar6),ZEXT416((uint)cVar7));
  fVar8 = pcVar18[i].m_transform.m_basis.m_el[1].m_floats[1];
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar3)),ZEXT416((uint)cVar5),ZEXT416((uint)cVar2)
                           );
  cVar9 = pcVar18[i].m_transform.m_basis.m_el[2].m_floats[1];
  auVar21 = vfmadd231ss_fma(auVar26,ZEXT416((uint)cVar9),ZEXT416((uint)cVar7));
  cVar10 = pcVar18[i].m_transform.m_basis.m_el[0].m_floats[2];
  fVar11 = pcVar18[i].m_transform.m_basis.m_el[1].m_floats[2];
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fVar3)),ZEXT416((uint)cVar10),
                            ZEXT416((uint)cVar2));
  cVar12 = pcVar18[i].m_transform.m_basis.m_el[2].m_floats[2];
  auVar22 = vfmadd231ss_fma(auVar26,ZEXT416((uint)cVar12),ZEXT416((uint)cVar7));
  cVar13 = (pcVar19->m_basis).m_el[1].m_floats[0];
  cVar14 = (pcVar19->m_basis).m_el[1].m_floats[1];
  auVar26 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)cVar14));
  auVar26 = vfmadd231ss_avx512f(auVar26,ZEXT416((uint)cVar4),ZEXT416((uint)cVar13));
  cVar15 = (pcVar19->m_basis).m_el[1].m_floats[2];
  auVar27 = vfmadd231ss_avx512f(auVar26,ZEXT416((uint)cVar6),ZEXT416((uint)cVar15));
  auVar26 = vmulss_avx512f(ZEXT416((uint)fVar8),ZEXT416((uint)cVar14));
  auVar26 = vfmadd231ss_avx512f(auVar26,ZEXT416((uint)cVar5),ZEXT416((uint)cVar13));
  auVar28 = vfmadd231ss_avx512f(auVar26,ZEXT416((uint)cVar9),ZEXT416((uint)cVar15));
  auVar26 = vmulss_avx512f(ZEXT416((uint)fVar11),ZEXT416((uint)cVar14));
  auVar26 = vfmadd231ss_avx512f(auVar26,ZEXT416((uint)cVar10),ZEXT416((uint)cVar13));
  auVar29 = vfmadd231ss_avx512f(auVar26,ZEXT416((uint)cVar12),ZEXT416((uint)cVar15));
  cVar16 = (pcVar19->m_basis).m_el[2].m_floats[0];
  cVar17 = (pcVar19->m_basis).m_el[2].m_floats[1];
  auVar26 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)cVar17));
  auVar26 = vfmadd231ss_avx512f(auVar26,ZEXT416((uint)cVar16),ZEXT416((uint)cVar4));
  cVar4 = (pcVar19->m_basis).m_el[2].m_floats[2];
  auVar23 = vfmadd231ss_fma(auVar26,ZEXT416((uint)cVar4),ZEXT416((uint)cVar6));
  auVar26 = vmulss_avx512f(ZEXT416((uint)fVar8),ZEXT416((uint)cVar17));
  auVar26 = vfmadd231ss_avx512f(auVar26,ZEXT416((uint)cVar16),ZEXT416((uint)cVar5));
  auVar24 = vfmadd231ss_fma(auVar26,ZEXT416((uint)cVar4),ZEXT416((uint)cVar9));
  auVar26 = vmulss_avx512f(ZEXT416((uint)fVar11),ZEXT416((uint)cVar17));
  auVar26 = vfmadd231ss_avx512f(auVar26,ZEXT416((uint)cVar16),ZEXT416((uint)cVar10));
  auVar25 = vfmadd231ss_fma(auVar26,ZEXT416((uint)cVar4),ZEXT416((uint)cVar12));
  cVar5 = pcVar18[i].m_transform.m_origin.m_floats[0];
  fVar1 = pcVar18[i].m_transform.m_origin.m_floats[1];
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar3)),ZEXT416((uint)cVar5),ZEXT416((uint)cVar2)
                           );
  cVar2 = pcVar18[i].m_transform.m_origin.m_floats[2];
  auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)cVar2),ZEXT416((uint)cVar7));
  auVar30 = vmulss_avx512f(ZEXT416((uint)cVar14),ZEXT416((uint)fVar1));
  auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)cVar5),ZEXT416((uint)cVar13));
  auVar31 = vfmadd231ss_avx512f(auVar30,ZEXT416((uint)cVar2),ZEXT416((uint)cVar15));
  auVar30 = vmulss_avx512f(ZEXT416((uint)cVar17),ZEXT416((uint)fVar1));
  auVar30 = vfmadd231ss_avx512f(auVar30,ZEXT416((uint)cVar5),ZEXT416((uint)cVar16));
  auVar30 = vfmadd231ss_fma(auVar30,ZEXT416((uint)cVar2),ZEXT416((uint)cVar4));
  auVar26 = vinsertps_avx(ZEXT416((uint)(auVar26._0_4_ + (pcVar19->m_origin).m_floats[0])),
                          ZEXT416((uint)(auVar31._0_4_ + (pcVar19->m_origin).m_floats[1])),0x10);
  local_40.m_origin.m_floats =
       (cbtScalar  [4])
       vinsertps_avx(auVar26,ZEXT416((uint)(auVar30._0_4_ + (pcVar19->m_origin).m_floats[2])),0x28);
  local_a0.m_worldTransform = &local_40;
  local_40.m_basis.m_el[0].m_floats[0] = auVar20._0_4_;
  local_40.m_basis.m_el[0].m_floats[1] = auVar21._0_4_;
  local_40.m_basis.m_el[0].m_floats[2] = auVar22._0_4_;
  local_40.m_basis.m_el[0].m_floats[3] = 0.0;
  local_40.m_basis.m_el[1].m_floats[0] = auVar27._0_4_;
  local_40.m_basis.m_el[1].m_floats[1] = auVar28._0_4_;
  local_40.m_basis.m_el[1].m_floats[2] = auVar29._0_4_;
  local_40.m_basis.m_el[1].m_floats[3] = 0.0;
  local_40.m_basis.m_el[2].m_floats[0] = auVar23._0_4_;
  local_40.m_basis.m_el[2].m_floats[1] = auVar24._0_4_;
  local_40.m_basis.m_el[2].m_floats[2] = auVar25._0_4_;
  local_40.m_basis.m_el[2].m_floats[3] = 0.0;
  local_a0.m_collisionObject = this->m_collisionObject;
  local_a0.m_parent = (cbtCollisionObjectWrapper *)0x0;
  local_a0.m_partId = -1;
  local_50 = this->m_resultCallback;
  local_78.m_collisionObject = (cbtCollisionObject *)0x0;
  local_78.m_collisionFilterGroup = 1;
  local_78.m_collisionFilterMask = -1;
  local_78._vptr_RayResultCallback = (_func_int **)&PTR__RayResultCallback_00b6fe30;
  local_78.m_closestHitFraction = local_50->m_closestHitFraction;
  local_78.m_flags = local_50->m_flags;
  local_a0.m_index = i;
  local_48 = i;
  rayTestSingleInternal(this->m_rayFromTrans,this->m_rayToTrans,&local_a0,&local_78);
  return;
}

Assistant:

void ProcessLeaf(int i)
					{
						const cbtCollisionShape* childCollisionShape = m_compoundShape->getChildShape(i);
						const cbtTransform& childTrans = m_compoundShape->getChildTransform(i);
						cbtTransform childWorldTrans = m_colObjWorldTransform * childTrans;

						cbtCollisionObjectWrapper tmpOb(0, childCollisionShape, m_collisionObject, childWorldTrans, -1, i);
						// replace collision shape so that callback can determine the triangle

						LocalInfoAdder2 my_cb(i, &m_resultCallback);

						rayTestSingleInternal(
							m_rayFromTrans,
							m_rayToTrans,
							&tmpOb,
							my_cb);
					}